

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_decompress(uint8_t *compressed,uint8_t *public_key)

{
  uECC_word_t *result;
  uECC_word_t uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uECC_word_t carry;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uECC_word_t local_108;
  uECC_word_t product [8];
  EccPoint point;
  uECC_word_t l_result [4];
  uECC_word_t p1 [4];
  
  vli_bytesToNative(product + 7,compressed + 1);
  curve_x_side(point.x + 3,product + 7);
  l_result[3] = 1;
  l_result[1] = 0;
  l_result[2] = 0;
  point.y[3] = 1;
  l_result[0] = 0;
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar9 = *(ulong *)((long)curve_p + lVar3);
    uVar8 = uVar9 + uVar5 + *(long *)((long)l_result + lVar3 + 0x18);
    if (uVar8 != uVar9) {
      uVar5 = (ulong)(uVar8 < uVar9);
    }
    *(ulong *)((long)l_result + lVar3 + 0x18) = uVar8;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  uVar7 = 3;
  iVar2 = -0xff;
  iVar4 = -0x101;
  iVar6 = -0x100;
  while (uVar5 = l_result[(ulong)uVar7 + 3], uVar5 == 0) {
    uVar7 = uVar7 - 1;
    iVar2 = iVar2 + 0x40;
    iVar4 = iVar4 + 0x40;
    iVar6 = iVar6 + 0x40;
    if (iVar6 == 0) goto LAB_001175b3;
  }
  lVar3 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar7 = (uint)lVar3 ^ 0x3f;
  if (2 < (int)-(iVar6 + uVar7)) {
    iVar6 = -uVar7;
    uVar10 = iVar6 - iVar4;
    uVar7 = iVar6 - iVar2;
    result = point.y + 3;
    do {
      vli_modSquare_fast(result,result);
      if ((l_result[(ulong)(uVar7 >> 6) + 3] >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
        vli_mult(&local_108,result,point.x + 3);
        vli_mmod_fast(result,&local_108);
      }
      uVar10 = uVar10 - 1;
      uVar7 = uVar7 - 1;
    } while (3 < uVar10);
  }
LAB_001175b3:
  point.y[1] = l_result[1];
  point.y[2] = l_result[2];
  point.x[3] = point.y[3];
  uVar1 = point.x[3];
  point.y[0] = l_result[0];
  point.x[3]._0_4_ = (uint)point.y[3];
  uVar7 = (uint)point.x[3] & 1;
  point.x[3] = uVar1;
  if (uVar7 != (*compressed & 1)) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar9 = *(long *)((long)point.x + lVar3 + 0x18) + uVar5;
      if (uVar9 != 0) {
        uVar5 = (ulong)(*(ulong *)((long)curve_p + lVar3) < uVar9);
      }
      *(ulong *)((long)point.x + lVar3 + 0x18) = *(ulong *)((long)curve_p + lVar3) - uVar9;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
  }
  vli_nativeToBytes(public_key,product + 7);
  vli_nativeToBytes(public_key + 0x20,point.x + 3);
  return;
}

Assistant:

void uECC_decompress(const uint8_t compressed[uECC_BYTES+1], uint8_t public_key[uECC_BYTES*2]) {
    EccPoint point;
    vli_bytesToNative(point.x, compressed + 1);
    curve_x_side(point.y, point.x);
    mod_sqrt(point.y);

    if ((point.y[0] & 0x01) != (compressed[0] & 0x01)) {
        vli_sub(point.y, curve_p, point.y);
    }

    vli_nativeToBytes(public_key, point.x);
    vli_nativeToBytes(public_key + uECC_BYTES, point.y);
}